

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_elements_confidentialtxin.cpp
# Opt level: O1

void __thiscall ConfidentialTxIn_SetIssuance_Test::TestBody(ConfidentialTxIn_SetIssuance_Test *this)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  AssertHelperData *pAVar2;
  undefined8 uVar3;
  bool bVar4;
  uint32_t uVar5;
  AssertHelperData *pAVar6;
  AssertHelperData *pAVar7;
  ulong uVar8;
  size_t sVar9;
  char *pcVar10;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_10;
  ConfidentialTxIn txin;
  undefined1 local_210 [32];
  internal local_1f0 [8];
  _Alloc_hider local_1e8;
  undefined1 local_1e0 [56];
  undefined1 local_1a8 [32];
  ConfidentialTxIn local_188;
  
  cfd::core::ConfidentialTxIn::ConfidentialTxIn(&local_188,&exp_txid,2,0xfffffffe,&exp_script);
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    bVar4 = testing::internal::AlwaysTrue();
    if (bVar4) {
      cfd::core::ConfidentialTxIn::SetIssuance
                (&local_188,&exp_blinding_nonce,&exp_asset_entropy,&exp_issuance_amount,
                 &exp_inflation_keys,&exp_issuance_amount_rangeproof,&exp_inflation_keys_rangeproof)
      ;
    }
  }
  else {
    testing::Message::Message((Message *)local_1e0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x8d,
               "Expected: (txin.SetIssuance(exp_blinding_nonce, exp_asset_entropy, exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof, exp_inflation_keys_rangeproof)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  local_210._0_4_ = cfd::core::AbstractTxIn::GetVout(&local_188.super_AbstractTxIn);
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_1e0,"txin.GetVout()","exp_index",(uint *)local_210,&exp_index);
  if (local_1e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if ((pointer)local_1e0._8_8_ == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x8f,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
    if ((AssertHelperData *)local_210._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_210._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_210._0_8_ + 8))();
      }
      local_210._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1e0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  uVar5 = cfd::core::AbstractTxIn::GetSequence(&local_188.super_AbstractTxIn);
  local_210._0_4_ = uVar5;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_1e0,"txin.GetSequence()","exp_sequence",(uint *)local_210,
             &exp_sequence);
  if (local_1e0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_210);
    if ((pointer)local_1e0._8_8_ == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e0._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x90,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1a8,(Message *)local_210);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1a8);
    if ((AssertHelperData *)local_210._0_8_ != (AssertHelperData *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((AssertHelperData *)local_210._0_8_ != (AssertHelperData *)0x0)) {
        (**(code **)(*(long *)local_210._0_8_ + 8))();
      }
      local_210._0_8_ = (AssertHelperData *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1e0 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::AbstractTxIn::GetTxid((Txid *)local_210,&local_188.super_AbstractTxIn);
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_1e0,(Txid *)local_210);
  uVar3 = local_1e0._0_8_;
  cfd::core::Txid::GetHex_abi_cxx11_((string *)local_1a8,&exp_txid);
  testing::internal::CmpHelperSTREQ
            (local_1f0,"txin.GetTxid().GetHex().c_str()","exp_txid.GetHex().c_str()",(char *)uVar3,
             (char *)local_1a8._0_8_);
  pAVar7 = (AssertHelperData *)(local_1a8 + 0x10);
  if ((AssertHelperData *)local_1a8._0_8_ != pAVar7) {
    operator_delete((void *)local_1a8._0_8_);
  }
  pbVar1 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (local_1e0 + 0x10);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_ !=
      pbVar1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  local_210._0_8_ = &PTR__Txid_0068dcd8;
  if ((pointer)local_210._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_210._8_8_);
  }
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if (local_1e8._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x91,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::AbstractTxIn::GetUnlockingScript((Script *)local_1e0,&local_188.super_AbstractTxIn);
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_210,(Script *)local_1e0);
  uVar3 = local_210._0_8_;
  cfd::core::Script::GetHex_abi_cxx11_((string *)local_1a8,&exp_script);
  testing::internal::CmpHelperSTREQ
            (local_1f0,"txin.GetUnlockingScript().GetHex().c_str()","exp_script.GetHex().c_str()",
             (char *)uVar3,(char *)local_1a8._0_8_);
  if ((AssertHelperData *)local_1a8._0_8_ != pAVar7) {
    operator_delete((void *)local_1a8._0_8_);
  }
  pAVar2 = (AssertHelperData *)(local_210 + 0x10);
  if ((AssertHelperData *)local_210._0_8_ != pAVar2) {
    operator_delete((void *)local_210._0_8_);
  }
  cfd::core::Script::~Script((Script *)local_1e0);
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if (local_1e8._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x93,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (AssertHelperData *)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_1a8._16_8_ = 0;
  uVar8 = (long)local_188.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar8);
  }
  local_1a8._16_8_ = uVar8 + (long)pAVar6;
  sVar9 = (long)local_188.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.blinding_nonce_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1a8._0_8_ = pAVar6;
  if (sVar9 != 0) {
    local_1a8._8_8_ = pAVar6;
    memmove(pAVar6,local_188.blinding_nonce_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_1a8._8_8_ = (long)pAVar6 + sVar9;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_1e0,(ByteData256 *)local_1a8);
  uVar3 = local_1e0._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_210,&exp_blinding_nonce);
  testing::internal::CmpHelperSTREQ
            (local_1f0,"txin.GetBlindingNonce().GetHex().c_str()",
             "exp_blinding_nonce.GetHex().c_str()",(char *)uVar3,(char *)local_210._0_8_);
  if ((AssertHelperData *)local_210._0_8_ != pAVar2) {
    operator_delete((void *)local_210._0_8_);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_ !=
      pbVar1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if ((AssertHelperData *)local_1a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if (local_1e8._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x95,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (AssertHelperData *)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_1a8._16_8_ = 0;
  uVar8 = (long)local_188.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar6 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar6 = (AssertHelperData *)operator_new(uVar8);
  }
  local_1a8._16_8_ = uVar8 + (long)pAVar6;
  sVar9 = (long)local_188.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.asset_entropy_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1a8._0_8_ = pAVar6;
  if (sVar9 != 0) {
    local_1a8._8_8_ = pAVar6;
    memmove(pAVar6,local_188.asset_entropy_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_1a8._8_8_ = (long)pAVar6 + sVar9;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_1e0,(ByteData256 *)local_1a8);
  uVar3 = local_1e0._0_8_;
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_210,&exp_asset_entropy);
  testing::internal::CmpHelperSTREQ
            (local_1f0,"txin.GetAssetEntropy().GetHex().c_str()",
             "exp_asset_entropy.GetHex().c_str()",(char *)uVar3,(char *)local_210._0_8_);
  if ((AssertHelperData *)local_210._0_8_ != pAVar2) {
    operator_delete((void *)local_210._0_8_);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_ !=
      pbVar1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if ((AssertHelperData *)local_1a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if (local_1e8._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x97,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_1e0,&local_188.issuance_amount_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_210,(ConfidentialValue *)local_1e0);
  uVar3 = local_210._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_1a8,&exp_issuance_amount);
  testing::internal::CmpHelperSTREQ
            (local_1f0,"txin.GetIssuanceAmount().GetHex().c_str()",
             "exp_issuance_amount.GetHex().c_str()",(char *)uVar3,(char *)local_1a8._0_8_);
  if ((AssertHelperData *)local_1a8._0_8_ != pAVar7) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if ((AssertHelperData *)local_210._0_8_ != pAVar2) {
    operator_delete((void *)local_210._0_8_);
  }
  local_1e0._0_8_ = &PTR__ConfidentialValue_006a2070;
  if ((pointer)local_1e0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e0._8_8_);
  }
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if (local_1e8._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x99,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialValue::ConfidentialValue
            ((ConfidentialValue *)local_1e0,&local_188.inflation_keys_);
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_
            ((string *)local_210,(ConfidentialValue *)local_1e0);
  uVar3 = local_210._0_8_;
  cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_1a8,&exp_inflation_keys);
  testing::internal::CmpHelperSTREQ
            (local_1f0,"txin.GetInflationKeys().GetHex().c_str()",
             "exp_inflation_keys.GetHex().c_str()",(char *)uVar3,(char *)local_1a8._0_8_);
  if ((AssertHelperData *)local_1a8._0_8_ != pAVar7) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if ((AssertHelperData *)local_210._0_8_ != pAVar2) {
    operator_delete((void *)local_210._0_8_);
  }
  local_1e0._0_8_ = &PTR__ConfidentialValue_006a2070;
  if ((pointer)local_1e0._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_1e0._8_8_);
  }
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if (local_1e8._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x9b,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (AssertHelperData *)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_1a8._16_8_ = 0;
  uVar8 = (long)local_188.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar7 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar7 = (AssertHelperData *)operator_new(uVar8);
  }
  local_1a8._16_8_ = uVar8 + (long)pAVar7;
  sVar9 = (long)local_188.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.issuance_amount_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1a8._0_8_ = pAVar7;
  if (sVar9 != 0) {
    local_1a8._8_8_ = pAVar7;
    memmove(pAVar7,local_188.issuance_amount_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_1a8._8_8_ = (long)pAVar7 + sVar9;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_1e0,(ByteData *)local_1a8);
  uVar3 = local_1e0._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_210,&exp_issuance_amount_rangeproof);
  testing::internal::CmpHelperSTREQ
            (local_1f0,"txin.GetIssuanceAmountRangeproof().GetHex().c_str()",
             "exp_issuance_amount_rangeproof.GetHex().c_str()",(char *)uVar3,(char *)local_210._0_8_
            );
  if ((AssertHelperData *)local_210._0_8_ != pAVar2) {
    operator_delete((void *)local_210._0_8_);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_ !=
      pbVar1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if ((AssertHelperData *)local_1a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if (local_1e8._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x9d,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1a8._0_8_ = (AssertHelperData *)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  local_1a8._16_8_ = 0;
  uVar8 = (long)local_188.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar8 == 0) {
    pAVar7 = (AssertHelperData *)0x0;
  }
  else {
    if ((long)uVar8 < 0) {
      std::__throw_bad_alloc();
    }
    pAVar7 = (AssertHelperData *)operator_new(uVar8);
  }
  local_1a8._16_8_ = uVar8 + (long)pAVar7;
  sVar9 = (long)local_188.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_188.inflation_keys_rangeproof_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start;
  local_1a8._0_8_ = pAVar7;
  if (sVar9 != 0) {
    local_1a8._8_8_ = pAVar7;
    memmove(pAVar7,local_188.inflation_keys_rangeproof_.data_.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start,sVar9);
  }
  local_1a8._8_8_ = (long)pAVar7 + sVar9;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_1e0,(ByteData *)local_1a8);
  uVar3 = local_1e0._0_8_;
  cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_210,&exp_inflation_keys_rangeproof);
  testing::internal::CmpHelperSTREQ
            (local_1f0,"txin.GetInflationKeysRangeproof().GetHex().c_str()",
             "exp_inflation_keys_rangeproof.GetHex().c_str()",(char *)uVar3,(char *)local_210._0_8_)
  ;
  if ((AssertHelperData *)local_210._0_8_ != pAVar2) {
    operator_delete((void *)local_210._0_8_);
  }
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_ !=
      pbVar1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if ((AssertHelperData *)local_1a8._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_1a8._0_8_);
  }
  if (local_1f0[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if (local_1e8._M_p == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1e8._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0x9f,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1e8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::ConfidentialTxIn::GetWitnessHash((ByteData256 *)local_210,&local_188);
  cfd::core::ByteData256::GetHex_abi_cxx11_((string *)local_1e0,(ByteData256 *)local_210);
  testing::internal::CmpHelperSTREQ
            ((internal *)local_1a8,"txin.GetWitnessHash().GetHex().c_str()",
             "\"66c6bd6d38aa080d0c840687accfcec970fa81cadebf94b379eda6a436f2a300\"",
             (char *)local_1e0._0_8_,
             "66c6bd6d38aa080d0c840687accfcec970fa81cadebf94b379eda6a436f2a300");
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_ !=
      pbVar1) {
    operator_delete((void *)local_1e0._0_8_);
  }
  if ((AssertHelperData *)local_210._0_8_ != (AssertHelperData *)0x0) {
    operator_delete((void *)local_210._0_8_);
  }
  if (local_1a8[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1e0);
    if ((pointer)local_1a8._8_8_ == (pointer)0x0) {
      pcVar10 = "";
    }
    else {
      pcVar10 = *(char **)local_1a8._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_210,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_elements_confidentialtxin.cpp"
               ,0xa1,pcVar10);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_210,(Message *)local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_210);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(undefined **)local_1e0._0_8_ + 8))();
      }
      local_1e0._0_8_ =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)(local_1a8 + 8),(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::core::ConfidentialTxIn::~ConfidentialTxIn(&local_188);
  return;
}

Assistant:

TEST(ConfidentialTxIn, SetIssuance) {
  ConfidentialTxIn txin(exp_txid, exp_index, exp_sequence, exp_script);
  EXPECT_NO_THROW((txin.SetIssuance(exp_blinding_nonce, exp_asset_entropy,
      exp_issuance_amount, exp_inflation_keys, exp_issuance_amount_rangeproof,
      exp_inflation_keys_rangeproof)));

  EXPECT_EQ(txin.GetVout(), exp_index);
  EXPECT_EQ(txin.GetSequence(), exp_sequence);
  EXPECT_STREQ(txin.GetTxid().GetHex().c_str(), exp_txid.GetHex().c_str());
  EXPECT_STREQ(txin.GetUnlockingScript().GetHex().c_str(),
      exp_script.GetHex().c_str());
  EXPECT_STREQ(txin.GetBlindingNonce().GetHex().c_str(),
      exp_blinding_nonce.GetHex().c_str());
  EXPECT_STREQ(txin.GetAssetEntropy().GetHex().c_str(),
      exp_asset_entropy.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmount().GetHex().c_str(),
      exp_issuance_amount.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeys().GetHex().c_str(),
      exp_inflation_keys.GetHex().c_str());
  EXPECT_STREQ(txin.GetIssuanceAmountRangeproof().GetHex().c_str(),
      exp_issuance_amount_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetInflationKeysRangeproof().GetHex().c_str(),
      exp_inflation_keys_rangeproof.GetHex().c_str());
  EXPECT_STREQ(txin.GetWitnessHash().GetHex().c_str(),
    "66c6bd6d38aa080d0c840687accfcec970fa81cadebf94b379eda6a436f2a300");
}